

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 9918.cpp
# Opt level: O1

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)3>::posit_sprite
          (Base<(TI::TMS::Personality)3> *this,int sprite_number,int sprite_position,
          uint8_t screen_row)

{
  uint8_t *puVar1;
  int iVar2;
  iterator pvVar3;
  byte bVar4;
  long lVar5;
  
  if (sprite_number == 0) {
    pvVar3 = (this->sprite_buffers_)._M_elems;
    if (this->fetch_sprite_buffer_ + 1 != (iterator)&this->fetch_sprite_buffer_) {
      pvVar3 = this->fetch_sprite_buffer_ + 1;
    }
    this->fetch_sprite_buffer_ = pvVar3;
    this->fetched_sprites_ = pvVar3;
    pvVar3->sprites_stopped = false;
    pvVar3->active_sprite_slot = 0;
    lVar5 = 0x10;
    do {
      puVar1 = pvVar3->active_sprites[0].image + lVar5 + -0xc;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      lVar5 = lVar5 + 0x14;
    } while (lVar5 != 0xb0);
    pvVar3->sprite_terminator =
         (this->fetch_line_buffer_->screen_mode - YamahaGraphics3 < 5) << 3 | 0xd0;
    pvVar3->is_filling = true;
  }
  if ((this->status_ & 0x40) == 0) {
    this->status_ = (byte)sprite_number & 0x1f | this->status_ & 0xa0;
  }
  pvVar3 = this->fetch_sprite_buffer_;
  if (pvVar3->sprites_stopped == false) {
    if (((this->mode_timing_).allow_sprite_terminator == true) &&
       ((uint)pvVar3->sprite_terminator == sprite_position)) {
      pvVar3->sprites_stopped = true;
      return;
    }
    bVar4 = screen_row - (char)sprite_position;
    if (bVar4 < this->sprite_height_) {
      iVar2 = pvVar3->active_sprite_slot;
      if (iVar2 == (this->mode_timing_).maximum_visible_sprites) {
        this->status_ = this->status_ | 0x40;
        return;
      }
      pvVar3->active_sprites[iVar2].index = sprite_number;
      pvVar3->active_sprites[iVar2].row = (uint)(bVar4 >> (this->sprites_magnified_ & 0x1fU));
      pvVar3->active_sprite_slot = iVar2 + 1;
    }
  }
  return;
}

Assistant:

void Base<personality>::posit_sprite(int sprite_number, int sprite_position, uint8_t screen_row) {
	// Evaluation of visibility of sprite 0 is always the first step in
	// populating a sprite buffer; so use it to uncork a new one.
	if(!sprite_number) {
		advance(fetch_sprite_buffer_);
		fetched_sprites_ = &*fetch_sprite_buffer_;
		fetch_sprite_buffer_->reset_sprite_collection();
		fetch_sprite_buffer_->sprite_terminator = mode_timing_.sprite_terminator(fetch_line_buffer_->screen_mode);

		if constexpr (SpriteBuffer::test_is_filling) {
			fetch_sprite_buffer_->is_filling = true;
		}
	}

	if(!(status_ & StatusSpriteOverflow)) {
		status_ = uint8_t((status_ & ~0x1f) | (sprite_number & 0x1f));
	}
	if(fetch_sprite_buffer_->sprites_stopped) return;

	// A sprite Y of 208 means "don't scan the list any further".
	if(mode_timing_.allow_sprite_terminator && sprite_position == fetch_sprite_buffer_->sprite_terminator) {
		fetch_sprite_buffer_->sprites_stopped = true;
		return;
	}

	const auto sprite_row = uint8_t(screen_row - sprite_position);
	if(sprite_row < 0 || sprite_row >= sprite_height_) return;

	if(fetch_sprite_buffer_->active_sprite_slot == mode_timing_.maximum_visible_sprites) {
		status_ |= StatusSpriteOverflow;
		return;
	}

	auto &sprite = fetch_sprite_buffer_->active_sprites[fetch_sprite_buffer_->active_sprite_slot];
	sprite.index = sprite_number;
	sprite.row = sprite_row >> (sprites_magnified_ ? 1 : 0);
	++fetch_sprite_buffer_->active_sprite_slot;
}